

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompilationcontext.cpp
# Opt level: O2

bool __thiscall
SQCompilation::SQCompilationContext::isRequireDisabled(SQCompilationContext *this,int line,int col)

{
  sqvector<SQCompilation::CommentData,_unsigned_int> *psVar1;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  CommentData *pCVar5;
  
  if (this->_comments == (Comments *)0x0) {
    bVar3 = false;
  }
  else {
    psVar1 = (this->_comments->_commentsList)._vals;
    pCVar5 = psVar1[line - 1U]._vals;
    lVar4 = (ulong)psVar1[line - 1U]._size * 0x30;
    do {
      bVar3 = lVar4 != 0;
      if (lVar4 == 0) {
        return bVar3;
      }
      pcVar2 = strstr(pCVar5->text,"-skip-require");
      pCVar5 = pCVar5 + 1;
      lVar4 = lVar4 + -0x30;
    } while (pcVar2 == (char *)0x0);
  }
  return bVar3;
}

Assistant:

bool SQCompilationContext::isRequireDisabled(int line, int col) {
  if (!_comments)
    return false;

  auto &lineCmts = _comments->lineComment(line);
  for (auto &comment : lineCmts) {
    if (strstr(comment.text, "-skip-require"))
      return true;
  }

  return false;
}